

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,unsigned_short,duckdb::UnaryLambdaWrapper,unsigned_short(*)(duckdb::string_t_const&)>
               (string_t *ldata,unsigned_short *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  unsigned_short uVar3;
  ulong uVar4;
  _func_unsigned_short_string_t_ptr **fun;
  undefined4 *puVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  idx_t local_50;
  ulong local_48;
  ulong local_40;
  unsigned_short *local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    puVar5 = (undefined4 *)((long)&ldata->value + 8);
    for (iVar7 = 0; count != iVar7; iVar7 = iVar7 + 1) {
      local_60 = puVar5[-2];
      uStack_5c = puVar5[-1];
      uStack_58 = *puVar5;
      uStack_54 = puVar5[1];
      uVar3 = (**dataptr)(&local_60);
      result_data[iVar7] = uVar3;
      puVar5 = puVar5 + 4;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    local_48 = count + 0x3f >> 6;
    uVar8 = 0;
    local_50 = count;
    for (local_40 = 0; local_40 != local_48; local_40 = local_40 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar6 = count;
        }
LAB_01486abe:
        puVar5 = (undefined4 *)((long)&ldata[uVar8].value + 8);
        for (; uVar4 = uVar8, uVar8 < uVar6; uVar8 = uVar8 + 1) {
          local_60 = puVar5[-2];
          uStack_5c = puVar5[-1];
          uStack_58 = *puVar5;
          uStack_54 = puVar5[1];
          uVar3 = (**dataptr)(&local_60);
          result_data[uVar8] = uVar3;
          puVar5 = puVar5 + 4;
        }
      }
      else {
        uVar2 = puVar1[local_40];
        uVar6 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar6 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_01486abe;
        uVar4 = uVar6;
        if (uVar2 != 0) {
          puVar5 = (undefined4 *)((long)&ldata[uVar8].value + 8);
          local_38 = result_data + uVar8;
          for (uVar9 = 0; uVar4 = uVar8 + uVar9, count = local_50, uVar8 + uVar9 < uVar6;
              uVar9 = uVar9 + 1) {
            if ((uVar2 >> (uVar9 & 0x3f) & 1) != 0) {
              local_60 = puVar5[-2];
              uStack_5c = puVar5[-1];
              uStack_58 = *puVar5;
              uStack_54 = puVar5[1];
              uVar3 = (**dataptr)(&local_60);
              local_38[uVar9] = uVar3;
            }
            puVar5 = puVar5 + 4;
          }
        }
      }
      uVar8 = uVar4;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}